

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

bool leveldb::ConsumeDecimalNumber(Slice *in,uint64_t *val)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  
  pcVar2 = in->data_;
  sVar5 = 0;
  uVar6 = 0;
  while( true ) {
    sVar3 = in->size_;
    if ((in->size_ == sVar5) || (bVar1 = pcVar2[sVar5], sVar3 = sVar5, (byte)(bVar1 - 0x3a) < 0xf6))
    {
      *val = uVar6;
      in->data_ = pcVar2 + sVar3;
      lVar4 = (long)(pcVar2 + sVar3) - (long)pcVar2;
      in->size_ = in->size_ - lVar4;
      return lVar4 != 0;
    }
    if ((0x1999999999999999 < uVar6) || (uVar6 == 0x1999999999999999 && 0x35 < bVar1)) break;
    uVar6 = (ulong)(bVar1 & 0xf) + uVar6 * 10;
    sVar5 = sVar5 + 1;
  }
  return false;
}

Assistant:

bool ConsumeDecimalNumber(Slice* in, uint64_t* val) {
  // Constants that will be optimized away.
  constexpr const uint64_t kMaxUint64 = std::numeric_limits<uint64_t>::max();
  constexpr const char kLastDigitOfMaxUint64 =
      '0' + static_cast<char>(kMaxUint64 % 10);

  uint64_t value = 0;

  // reinterpret_cast-ing from char* to uint8_t* to avoid signedness.
  const uint8_t* start = reinterpret_cast<const uint8_t*>(in->data());

  const uint8_t* end = start + in->size();
  const uint8_t* current = start;
  for (; current != end; ++current) {
    const uint8_t ch = *current;
    if (ch < '0' || ch > '9') break;

    // Overflow check.
    // kMaxUint64 / 10 is also constant and will be optimized away.
    if (value > kMaxUint64 / 10 ||
        (value == kMaxUint64 / 10 && ch > kLastDigitOfMaxUint64)) {
      return false;
    }

    value = (value * 10) + (ch - '0');
  }

  *val = value;
  const size_t digits_consumed = current - start;
  in->remove_prefix(digits_consumed);
  return digits_consumed != 0;
}